

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O2

void __thiscall xray_re::xr_object::save_skls(xr_object *this,xr_writer *w)

{
  f_w_const<xray_re::xr_skl_motion> write;
  undefined4 in_EAX;
  undefined4 uVar1;
  undefined8 unaff_RBX;
  
  uVar1 = (undefined4)
          ((ulong)((long)(this->m_motions).
                         super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_motions).
                        super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
  (*w->_vptr_xr_writer[2])(w,&stack0xffffffffffffffec,4);
  write.m_f._4_4_ = uVar1;
  write.m_f._0_4_ = in_EAX;
  write._8_8_ = unaff_RBX;
  xr_writer::
  w_seq<std::vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>>,xray_re::xr_writer::f_w_const<xray_re::xr_skl_motion>>
            (w,&this->m_motions,write);
  return;
}

Assistant:

void xr_object::save_skls(xr_writer& w) const
{
	w.w_size_u32(m_motions.size());
	w.w_seq(m_motions, xr_writer::f_w_const<xr_skl_motion>(&xr_skl_motion::save));
}